

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall USDFParser::ParseConversation(USDFParser *this)

{
  FName FVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  FStrifeDialogueNode **ppFVar6;
  undefined1 local_30 [8];
  FName key;
  int iStack_24;
  bool block;
  uint startpos;
  int dlgid;
  PClassActor *type;
  USDFParser *this_local;
  
  _startpos = (PClassActor *)0x0;
  iStack_24 = -1;
  key.Index = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Size(&StrifeDialogues);
  while (bVar2 = FScanner::CheckToken((FScanner *)this,0x7d), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_30[7] = 0;
    UDMFParserBase::ParseKey((UDMFParserBase *)local_30,SUB81(this,0),(bool *)0x1);
    if ((local_30[7] & 1) == 0) {
      iVar3 = FName::operator_cast_to_int((FName *)local_30);
      if (iVar3 == 4) {
        pcVar5 = FName::operator_cast_to_char_((FName *)local_30);
        _startpos = CheckActorType(this,pcVar5);
        if ((this->super_UDMFParserBase).namespace_bits == 2) {
          pcVar5 = FName::operator_cast_to_char_((FName *)local_30);
          iStack_24 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar5);
        }
      }
      else if ((iVar3 == 0x11f) && ((this->super_UDMFParserBase).namespace_bits == 1)) {
        pcVar5 = FName::operator_cast_to_char_((FName *)local_30);
        iStack_24 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar5);
      }
    }
    else {
      iVar3 = FName::operator_cast_to_int((FName *)local_30);
      if (iVar3 == 0x1e8) {
        bVar2 = ParsePage(this);
        if (!bVar2) {
          return false;
        }
      }
      else {
        FScanner::UnGet((FScanner *)this);
        UDMFParserBase::Skip(&this->super_UDMFParserBase);
      }
    }
  }
  if ((_startpos == (PClassActor *)0x0) && (iStack_24 == 0)) {
    FScanner::ScriptMessage((FScanner *)this,"No valid actor type defined in conversation.");
    return false;
  }
  SetConversation(iStack_24,_startpos,key.Index);
  for (; FVar1.Index = key.Index,
      uVar4 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Size(&StrifeDialogues),
      (uint)FVar1.Index < uVar4; key.Index = key.Index + 1) {
    ppFVar6 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                        (&StrifeDialogues,(ulong)(uint)key.Index);
    (*ppFVar6)->SpeakerType = _startpos;
  }
  return true;
}

Assistant:

bool ParseConversation()
	{
		PClassActor *type = NULL;
		int dlgid = -1;
		unsigned int startpos = StrifeDialogues.Size();

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Actor:
					type = CheckActorType(key);
					if (namespace_bits == St)
					{
						dlgid = CheckInt(key);
					}
					break;

				case NAME_Id:
					if (namespace_bits == Zd)
					{
						dlgid = CheckInt(key);
					}
					break;
				}
			}
			else
			{
				switch(key)
				{
				case NAME_Page:
					if (!ParsePage()) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		if (type == NULL && dlgid == 0)
		{
			sc.ScriptMessage("No valid actor type defined in conversation.");
			return false;
		}
		SetConversation(dlgid, type, startpos);
		for(;startpos < StrifeDialogues.Size(); startpos++)
		{
			StrifeDialogues[startpos]->SpeakerType = type;
		}
		return true;
	}